

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

UBool __thiscall icu_63::LocaleKey::fallback(LocaleKey *this)

{
  UBool UVar1;
  uint uVar2;
  int32_t iVar3;
  int x;
  LocaleKey *this_local;
  
  UVar1 = UnicodeString::isBogus(&this->_currentID);
  if (UVar1 == '\0') {
    uVar2 = UnicodeString::lastIndexOf(&this->_currentID,L'_');
    if (uVar2 != 0xffffffff) {
      UnicodeString::remove(&this->_currentID,(char *)(ulong)uVar2);
      return '\x01';
    }
    UVar1 = UnicodeString::isBogus(&this->_fallbackID);
    if (UVar1 == '\0') {
      UnicodeString::operator=(&this->_currentID,&this->_fallbackID);
      UnicodeString::setToBogus(&this->_fallbackID);
      return '\x01';
    }
    iVar3 = UnicodeString::length(&this->_currentID);
    if (0 < iVar3) {
      UnicodeString::remove(&this->_currentID,(char *)0x0);
      return '\x01';
    }
    UnicodeString::setToBogus(&this->_currentID);
  }
  return '\0';
}

Assistant:

UBool
LocaleKey::fallback() {
    if (!_currentID.isBogus()) {
        int x = _currentID.lastIndexOf(UNDERSCORE_CHAR);
        if (x != -1) {
            _currentID.remove(x); // truncate current or fallback, whichever we're pointing to
            return TRUE;
        }

        if (!_fallbackID.isBogus()) {
            _currentID = _fallbackID;
            _fallbackID.setToBogus();
            return TRUE;
        }

        if (_currentID.length() > 0) {
            _currentID.remove(0); // completely truncate
            return TRUE;
        }

        _currentID.setToBogus();
    }

    return FALSE;
}